

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalMaterializedCTE::Deserialize(LogicalMaterializedCTE *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  LogicalOperator *this_00;
  pointer pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  string *this_01;
  unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
  result;
  _Head_base<0UL,_duckdb::LogicalMaterializedCTE_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  idx_t iVar4;
  
  this_00 = (LogicalOperator *)operator_new(0xb0);
  LogicalOperator::LogicalOperator(this_00,LOGICAL_MATERIALIZED_CTE);
  this_00[1]._vptr_LogicalOperator = (_func_int **)&this_00[1].children;
  *(undefined8 *)&this_00[1].type = 0;
  *(undefined1 *)
   &this_00[1].children.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  this_00[1].expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[1].expressions.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[1].types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalCTE_02498290;
  local_58._M_head_impl = (LogicalMaterializedCTE *)this_00;
  pLVar3 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_index");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  (pLVar3->super_LogicalCTE).table_index = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pLVar3 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"column_count");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var_00,iVar2);
  }
  (pLVar3->super_LogicalCTE).column_count = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pLVar3 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"ctename");
  this_01 = &(pLVar3->super_LogicalCTE).ctename;
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010b0aa2;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010b0aa2;
  }
  operator_delete(local_50);
LAB_010b0aa2:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_LogicalCTE).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalMaterializedCTE::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalMaterializedCTE>(new LogicalMaterializedCTE());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "column_count", result->column_count);
	deserializer.ReadPropertyWithDefault<string>(202, "ctename", result->ctename);
	return std::move(result);
}